

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
          (RepeatedMessageFieldGenerator *this,FieldDescriptor *descriptor,Options *options,
          MessageSCCAnalyzer *scc_analyzer)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  Descriptor *descriptor_00;
  
  (this->super_FieldGenerator).descriptor_ = descriptor;
  (this->super_FieldGenerator).options_ = options;
  p_Var1 = &(this->super_FieldGenerator).variables_._M_t._M_impl.super__Rb_tree_header;
  (this->super_FieldGenerator).variables_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_FieldGenerator).variables_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_FieldGenerator).variables_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_FieldGenerator).variables_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_FieldGenerator).variables_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__RepeatedMessageFieldGenerator_004d9e70;
  bVar2 = IsImplicitWeakField(descriptor,options,scc_analyzer);
  this->implicit_weak_field_ = bVar2;
  descriptor_00 = FieldDescriptor::message_type(descriptor);
  bVar2 = MessageSCCAnalyzer::HasRequiredFields(scc_analyzer,descriptor_00);
  this->has_required_fields_ = bVar2;
  anon_unknown_6::SetMessageVariables
            (descriptor,options,this->implicit_weak_field_,&(this->super_FieldGenerator).variables_)
  ;
  return;
}

Assistant:

RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options,
    MessageSCCAnalyzer* scc_analyzer)
    : FieldGenerator(descriptor, options),
      implicit_weak_field_(
          IsImplicitWeakField(descriptor, options, scc_analyzer)),
      has_required_fields_(
          scc_analyzer->HasRequiredFields(descriptor->message_type())) {
  SetMessageVariables(descriptor, options, implicit_weak_field_, &variables_);
}